

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListCase.cpp
# Opt level: O2

char * glcts::getConfigTypeName(ConfigType type)

{
  Exception *this;
  allocator<char> local_39;
  string local_38;
  
  if (type < CONFIGTYPE_LAST) {
    return &DAT_017d9438 + *(int *)(&DAT_017d9438 + (ulong)type * 4);
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Unknown config type",&local_39);
  tcu::Exception::Exception(this,&local_38);
  __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static const char* getConfigTypeName(ConfigType type)
{
	switch (type)
	{
	case CONFIGTYPE_DEFAULT:
		return "default";
	case CONFIGTYPE_EGL:
		return "EGL";
	case CONFIGTYPE_WGL:
		return "WGL";
	default:
		throw tcu::Exception("Unknown config type");
	}
}